

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setDate(QDateTimeEdit *this,QDate date)

{
  QDate min;
  bool bVar1;
  QFlagsStorage<QDateTimeEdit::Section> QVar2;
  undefined4 uVar3;
  QDateTimeEditPrivate *this_00;
  QDate in_RSI;
  QDateTimeEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  QDateTime when;
  undefined8 in_stack_ffffffffffffff78;
  Section other;
  QDateTimeEditPrivate *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QDateTimeEditPrivate *pQVar4;
  QTime time;
  undefined1 *local_50 [2];
  undefined4 in_stack_ffffffffffffffc8;
  QVariant local_28;
  long local_8;
  
  other = (Section)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  this_00 = d_func((QDateTimeEdit *)0x558385);
  time.mds = (int)((ulong)pQVar4 >> 0x20);
  bVar1 = QDate::isValid((QDate *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (bVar1) {
    QVar2.i = (Int)QFlags<QDateTimeEdit::Section>::operator&
                             ((QFlags<QDateTimeEdit::Section> *)in_stack_ffffffffffffff80,other);
    bVar1 = QFlags<QDateTimeEdit::Section>::operator!
                      ((QFlags<QDateTimeEdit::Section> *)&stack0xffffffffffffffcc);
    if (bVar1) {
      min.jd._4_4_ = (QFlagsStorage<QDateTimeEdit::Section>)
                     (QFlagsStorage<QDateTimeEdit::Section>)QVar2.i;
      min.jd._0_4_ = in_stack_ffffffffffffffc8;
      setDateRange((QDateTimeEdit *)this_00,min,in_RSI);
    }
    (**(code **)(*(long *)&(this_00->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xf8))();
    local_50[0] = &DAT_aaaaaaaaaaaaaaaa;
    uVar3 = ::QVariant::toTime();
    QDateTimeEditPrivate::dateTimeValue(in_stack_ffffffffffffff80,in_RSI,time);
    ::QVariant::QVariant(&local_28,(QDateTime *)local_50);
    QAbstractSpinBoxPrivate::setValue
              (&this_00->super_QAbstractSpinBoxPrivate,
               (QVariant *)CONCAT44(uVar3,in_stack_ffffffffffffff90),
               (EmitPolicy)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    ::QVariant::~QVariant(&local_28);
    QDateTimeEditPrivate::updateTimeZone(in_RDI);
    QDateTime::~QDateTime((QDateTime *)local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setDate(QDate date)
{
    Q_D(QDateTimeEdit);
    if (date.isValid()) {
        if (!(d->sections & DateSections_Mask))
            setDateRange(date, date);

        d->clearCache();
        QDateTime when = d->dateTimeValue(date, d->value.toTime());
        Q_ASSERT(when.isValid());
        d->setValue(when, EmitIfChanged);
        d->updateTimeZone();
    }
}